

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_points.h
# Opt level: O3

PrimInfo * __thiscall
embree::avx2::PointsISA::createPrimRefArray
          (PrimInfo *__return_storage_ptr__,PointsISA *this,PrimRef *prims,range<unsigned_long> *r,
          size_t k,uint geomID)

{
  BufferView<embree::Vec3fx> *pBVar1;
  char *pcVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar4;
  float fVar5;
  size_t sVar6;
  size_t sVar7;
  undefined4 uVar8;
  long lVar9;
  uint index;
  ulong uVar10;
  long lVar11;
  unsigned_long uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar17;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar18;
  undefined1 auVar19 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar20;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar21;
  undefined1 auVar22 [64];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar14 [64];
  undefined1 auVar16 [64];
  
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar10 = r->_begin;
  uVar12 = r->_end;
  if (uVar10 < uVar12) {
    auVar13._8_4_ = 0xff800000;
    auVar13._0_8_ = 0xff800000ff800000;
    auVar13._12_4_ = 0xff800000;
    auVar14 = ZEXT1664(auVar13);
    auVar15._8_4_ = 0x7f800000;
    auVar15._0_8_ = 0x7f8000007f800000;
    auVar15._12_4_ = 0x7f800000;
    auVar16 = ZEXT1664(auVar15);
    sVar6 = 0;
    auVar23._8_4_ = 0xddccb9a2;
    auVar23._0_8_ = 0xddccb9a2ddccb9a2;
    auVar23._12_4_ = 0xddccb9a2;
    auVar24._8_4_ = 0x5dccb9a2;
    auVar24._0_8_ = 0x5dccb9a25dccb9a2;
    auVar24._12_4_ = 0x5dccb9a2;
    auVar19 = ZEXT1664(auVar15);
    auVar22 = ZEXT1664(auVar13);
    do {
      pBVar1 = (this->super_Points).vertices.items;
      sVar7 = k;
      if ((uVar10 & 0xffffffff) < (pBVar1->super_RawBufferView).num) {
        lVar9 = (uVar10 & 0xffffffff) * (pBVar1->super_RawBufferView).stride;
        pcVar2 = (pBVar1->super_RawBufferView).ptr_ofs;
        if (0.0 <= *(float *)(pcVar2 + lVar9 + 0xc)) {
          auVar13 = *(undefined1 (*) [16])(pcVar2 + lVar9);
          auVar15 = vcmpps_avx(auVar13,auVar23,2);
          auVar13 = vcmpps_avx(auVar13,auVar24,5);
          auVar13 = vorps_avx(auVar15,auVar13);
          uVar8 = vmovmskps_avx(auVar13);
          if ((char)uVar8 == '\0') {
            lVar9 = *(long *)&(this->super_Points).super_Geometry.field_0x58;
            lVar11 = *(long *)&(this->super_Points).field_0x68 * uVar10;
            auVar13 = *(undefined1 (*) [16])(lVar9 + lVar11);
            fVar5 = *(float *)(lVar9 + 0xc + lVar11) * (this->super_Points).maxRadiusScale;
            auVar26._4_4_ = fVar5;
            auVar26._0_4_ = fVar5;
            auVar26._8_4_ = fVar5;
            auVar26._12_4_ = fVar5;
            auVar15 = vsubps_avx(auVar13,auVar26);
            aVar3 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                    vinsertps_avx(auVar15,ZEXT416(geomID),0x30);
            auVar25._0_4_ = auVar13._0_4_ + fVar5;
            auVar25._4_4_ = auVar13._4_4_ + fVar5;
            auVar25._8_4_ = auVar13._8_4_ + fVar5;
            auVar25._12_4_ = auVar13._12_4_ + fVar5;
            aVar4 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                    vinsertps_avx(auVar25,ZEXT416((uint)uVar10),0x30);
            auVar13 = vminps_avx(auVar16._0_16_,(undefined1  [16])aVar3);
            auVar16 = ZEXT1664(auVar13);
            auVar13 = vmaxps_avx(auVar14._0_16_,(undefined1  [16])aVar4);
            auVar14 = ZEXT1664(auVar13);
            auVar27._0_4_ = aVar3.x + aVar4.x;
            auVar27._4_4_ = aVar3.y + aVar4.y;
            auVar27._8_4_ = aVar3.z + aVar4.z;
            auVar27._12_4_ = aVar3.field_3.w + aVar4.field_3.w;
            auVar13 = vminps_avx(auVar19._0_16_,auVar27);
            auVar19 = ZEXT1664(auVar13);
            auVar13 = vmaxps_avx(auVar22._0_16_,auVar27);
            auVar22 = ZEXT1664(auVar13);
            sVar6 = sVar6 + 1;
            sVar7 = k + 1;
            prims[k].upper.field_0.field_1 = aVar4;
            prims[k].lower.field_0.field_1 = aVar3;
            uVar12 = r->_end;
          }
        }
      }
      aVar20 = auVar22._0_16_;
      aVar17 = auVar19._0_16_;
      aVar21 = auVar14._0_16_;
      aVar18 = auVar16._0_16_;
      uVar10 = uVar10 + 1;
      k = sVar7;
    } while (uVar10 < uVar12);
  }
  else {
    aVar18.m128[2] = INFINITY;
    aVar18._0_8_ = 0x7f8000007f800000;
    aVar18.m128[3] = INFINITY;
    aVar21.m128[2] = -INFINITY;
    aVar21._0_8_ = 0xff800000ff800000;
    aVar21.m128[3] = -INFINITY;
    sVar6 = 0;
    aVar17 = aVar18;
    aVar20 = aVar21;
  }
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       aVar18;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       aVar21;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       aVar17;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       aVar20;
  __return_storage_ptr__->end = sVar6;
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArray(PrimRef* prims, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j = r.begin(); j < r.end(); j++) {
          BBox3fa bounds = empty;
          if (!buildBounds(j, &bounds))
            continue;
          const PrimRef prim(bounds, geomID, unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }